

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_statement_verifier.cpp
# Opt level: O3

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::ParsedStatementVerifier::Create
          (ParsedStatementVerifier *this,SQLStatement *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  ParserOptions options_p;
  reference pvVar1;
  ParsedStatementVerifier *this_00;
  string query_str;
  Parser parser;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_d0 [4];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  string local_98 [2];
  Parser local_58;
  
  (*statement->_vptr_SQLStatement[2])(local_98);
  local_b0 = 1;
  uStack_a8 = 1000;
  local_a0 = 0;
  options_p.max_expression_depth = 1000;
  options_p.preserve_identifier_case = true;
  options_p.integer_division = false;
  options_p._2_6_ = 0;
  options_p.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  Parser::Parser(&local_58,options_p);
  Parser::ParseQuery(&local_58,local_98);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
           ::operator[](&local_58.statements,0);
  this_00 = (ParsedStatementVerifier *)operator_new(0x50);
  local_d0[0]._M_head_impl =
       (pvVar1->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
       _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pvVar1->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  ParsedStatementVerifier
            (this_00,(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)local_d0,parameters);
  if (local_d0[0]._M_head_impl != (SQLStatement *)0x0) {
    (*(local_d0[0]._M_head_impl)->_vptr_SQLStatement[1])();
  }
  (this->super_StatementVerifier)._vptr_StatementVerifier = (_func_int **)this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
    operator_delete(local_98[0]._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
ParsedStatementVerifier::Create(const SQLStatement &statement,
                                optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	auto query_str = statement.ToString();
	Parser parser;
	try {
		parser.ParseQuery(query_str);
	} catch (std::exception &ex) {
		throw InternalException("Parsed statement verification failed. Query:\n%s\n\nError: %s", query_str, ex.what());
	}
	D_ASSERT(parser.statements.size() == 1);
	D_ASSERT(parser.statements[0]->type == StatementType::SELECT_STATEMENT);
	return make_uniq<ParsedStatementVerifier>(std::move(parser.statements[0]), parameters);
}